

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFileListGeneratorFixed::~cmFileListGeneratorFixed(cmFileListGeneratorFixed *this)

{
  ~cmFileListGeneratorFixed(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmFileListGeneratorFixed(std::string const& str)
    : cmFileListGeneratorBase()
    , String(str)
  {
  }